

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O1

void __thiscall Arbitraryint::~Arbitraryint(Arbitraryint *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016a498;
  testinator::TestRegistry::Unregister((this->super_Test).m_registry,&this->super_Test);
  pcVar2 = (this->super_Test).m_name._M_dataplus._M_p;
  paVar1 = &(this->super_Test).m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(int, Arbitrary)
{
  testinator::Arbitrary<int> a;
  int v = a.generate(0,0);
  a.shrink(v);
  return true;
}